

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O2

int GetFrameSBG(SBG *pSBG,SBGDATA *pSBGData)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int local_20a4;
  int framelen;
  int mclass;
  int mid;
  int nbBytesDiscarded;
  uchar *ptr;
  SBGDATA *local_2088;
  CHRONO chrono;
  uchar recvbuf [8192];
  
  nbBytesDiscarded = 0;
  ptr = (uchar *)0x0;
  framelen = 0;
  mid = 0;
  mclass = 0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x2000);
  local_20a4 = 9;
  iVar1 = ReadAllRS232Port(&pSBG->RS232Port,recvbuf,9);
  if (iVar1 == 0) {
    iVar1 = 9;
    local_2088 = pSBGData;
    do {
      iVar2 = FindFrameSBG(recvbuf,iVar1,&mid,&mclass,&framelen,&local_20a4,&ptr,&nbBytesDiscarded);
      if (iVar2 == 1) {
        local_20a4 = 9;
        if (nbBytesDiscarded < 9) {
          local_20a4 = nbBytesDiscarded;
        }
      }
      else if (iVar2 == 0) {
        if (0 < iVar1 - (nbBytesDiscarded + framelen)) {
          puts("Warning getting data from a SBG : Unexpected data after a frame. ");
        }
        iVar1 = ProcessFrameSBG(pSBG,ptr,framelen,mid,mclass,local_2088);
        return (uint)(iVar1 != 0);
      }
      iVar2 = local_20a4;
      iVar1 = iVar1 - nbBytesDiscarded;
      memmove(recvbuf,recvbuf + nbBytesDiscarded,(long)iVar1);
      if (0x1fff < iVar2 + iVar1) {
        puts("Error reading data from a SBG : Invalid data. ");
        return 4;
      }
      iVar2 = ReadAllRS232Port(&pSBG->RS232Port,recvbuf + iVar1,iVar2);
      if (iVar2 != 0) goto LAB_00174d67;
      iVar1 = iVar1 + local_20a4;
      dVar3 = GetTimeElapsedChronoQuick(&chrono);
    } while (dVar3 <= 4.0);
    puts("Error reading data from a SBG : Frame timeout. ");
    iVar1 = 2;
  }
  else {
LAB_00174d67:
    puts("Error reading data from a SBG. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetFrameSBG(SBG* pSBG, SBGDATA* pSBGData)
{
	unsigned char recvbuf[MAX_NB_BYTES_SBG];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	int framelen = 0;
	int mid = 0, mclass = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_SBG-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_FRAME_LEN_SBG;
	if (ReadAllRS232Port(&pSBG->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SBG. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindFrameSBG(recvbuf, BytesReceived, &mid, &mclass, &framelen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_FRAME_LEN_SBG, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a SBG : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pSBG->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a SBG. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_SBG)
		{
			printf("Error reading data from a SBG : Frame timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-framelen > 0)
	{
		printf("Warning getting data from a SBG : Unexpected data after a frame. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *pframelen)
	//{
	//	printf("Error getting data from a SBG : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*pframelen > 0)
	//{
	//	memcpy(databuf, ptr, *pframelen);
	//}

	if (ProcessFrameSBG(pSBG, ptr, framelen, mid, mclass, pSBGData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}